

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O2

int do_cmp(void)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  undefined4 *puVar4;
  uint uVar5;
  
  uVar5 = registe_ptr->IP;
  bVar1 = code_ptr[uVar5 + 2];
  bVar2 = bVar1 >> 4;
  if (code_ptr[uVar5 + 1] == '\x01') {
    uVar5 = *register_list[bVar2] - (int)code_ptr[uVar5 + 3];
LAB_00103a2d:
    set_flag(uVar5);
    return 1;
  }
  if (code_ptr[uVar5 + 1] == '\0') {
    bVar3 = (byte)code_ptr[uVar5 + 3] >> 4;
    if ((bVar1 & 0xf) == 2) {
      uVar5 = *register_list[bVar2] - *register_list[bVar3];
      goto LAB_00103a2d;
    }
    if ((bVar1 & 0xf) == 1) {
      set_flag((short)*register_list[bVar2] - (short)*register_list[bVar3]);
      return 1;
    }
    if ((bVar1 & 0xf) == 0) {
      set_flag((char)*register_list[bVar2] - (char)*register_list[bVar3]);
      return 1;
    }
  }
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 0xf6;
  __cxa_throw(puVar4,&int::typeinfo,0);
}

Assistant:

int do_cmp() {
	uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 2] / 0x10;
	uint8_t low = (uint8_t)code_ptr[registe_ptr->IP + 2] % 0x10;
	if (code_ptr[registe_ptr->IP + 1] == '\x00') {//寄存器比较
			uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
			if (low == 0) {
				char*Ra = (char *)register_list[high];
				char*Rb = (char*)register_list[highb];
				char temp = *Ra - *Rb;
				set_flag(temp);
			}
			else if (low == 1)
			{
				int16_t*Ra = (int16_t *)register_list[high];
				int16_t*Rb = (int16_t *)register_list[highb];
				int16_t temp = *Ra - *Rb;
				set_flag(temp);
			}
			else if (low == 2)
			{
				unsigned*Ra = (unsigned *)register_list[high];
				unsigned*Rb = (unsigned*)register_list[highb];
				unsigned temp = *Ra - *Rb;
				set_flag(temp);
			}
			else throw(LVM_EXECUTE_ERROR);
	}
	else if (code_ptr[registe_ptr->IP + 1] == '\x01') {//立即数比较
		unsigned i = code_ptr[registe_ptr->IP + 3];
		set_flag(*register_list[high] - i);
	}
	else throw(LVM_EXECUTE_ERROR);
	return LVM_SUCCESS;
}